

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptSaveString(char ***argvp,uint argInfo,char *val)

{
  char **ppcVar1;
  size_t sVar2;
  char *pcVar3;
  int local_2c;
  int argc;
  char *val_local;
  uint argInfo_local;
  char ***argvp_local;
  
  local_2c = 0;
  if ((argvp == (char ***)0x0) || (val == (char *)0x0)) {
    argvp_local._4_4_ = -0x14;
  }
  else {
    if (*argvp != (char **)0x0) {
      for (; (*argvp)[local_2c] != (char *)0x0; local_2c = local_2c + 1) {
      }
    }
    ppcVar1 = (char **)realloc(*argvp,(long)(local_2c + 2) << 3);
    if (ppcVar1 == (char **)0x0) {
      fprintf(_stderr,"virtual memory exhausted.\n");
      exit(1);
    }
    *argvp = ppcVar1;
    if (ppcVar1 != (char **)0x0) {
      sVar2 = strlen(val);
      pcVar3 = (char *)malloc(sVar2 + 1);
      if (pcVar3 == (char *)0x0) {
        fprintf(_stderr,"virtual memory exhausted.\n");
        exit(1);
      }
      pcVar3 = strcpy(pcVar3,val);
      (*argvp)[local_2c] = pcVar3;
      (*argvp)[local_2c + 1] = (char *)0x0;
    }
    argvp_local._4_4_ = 0;
  }
  return argvp_local._4_4_;
}

Assistant:

int poptSaveString(const char *** argvp,
		UNUSED(unsigned int argInfo), const char * val)
{
    int argc = 0;

    if (argvp == NULL || val == NULL)
	return POPT_ERROR_NULLARG;

    /* XXX likely needs an upper bound on argc. */
    if (*argvp != NULL)
    while ((*argvp)[argc] != NULL)
	argc++;
 
    if ((*argvp = xrealloc(*argvp, (argc + 1 + 1) * sizeof(**argvp))) != NULL) {
	(*argvp)[argc++] = xstrdup(val);
	(*argvp)[argc  ] = NULL;
    }
    return 0;
}